

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O2

void __thiscall beast::unit_test::runner::pass<void>(runner *this)

{
  allocator local_31;
  string local_30;
  
  ::std::recursive_mutex::lock((recursive_mutex *)&this->mutex_);
  if (this->default_ == true) {
    ::std::__cxx11::string::string((string *)&local_30,"",&local_31);
    testcase<void>(this,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  (*this->_vptr_runner[6])(this);
  this->cond_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void
runner::pass()
{
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if(default_)
        testcase("");
    on_pass();
    cond_ = true;
}